

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

bool Path::is_file(string *path)

{
  int iVar1;
  stat s;
  stat local_a0;
  
  memset(&local_a0,0,0x90);
  iVar1 = stat((path->_M_dataplus)._M_p,&local_a0);
  return (short)local_a0.st_mode < 0 && iVar1 == 0;
}

Assistant:

bool is_file(const std::string &path)
{
#ifdef _WIN32
	struct __stat64 s;
	if (_stat64(path.c_str(), &s) < 0)
		return false;
	return (s.st_mode & _S_IFREG) != 0;
#else
	struct stat s = {};
	return ::stat(path.c_str(), &s) == 0 && (s.st_mode & S_IFREG) != 0;
#endif
}